

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onEnterWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *param_1)

{
  element_type *peVar1;
  unsigned_long local_10;
  
  peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_10 = (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->byteCode).
                   super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&peVar1->loopStartIndices,&local_10);
  return;
}

Assistant:

void onEnterWhileStatementAstNode(WhileStatementAstNode*  /*node*/) noexcept override {
    this->ec->loopStartIndices.push_back(this->ec->byteCode.size());
  }